

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

Type * __thiscall soul::heart::StructElement::getType(StructElement *this)

{
  string_view memberName;
  Structure *this_00;
  Member *pMVar1;
  StructElement *this_local;
  
  this_00 = getStruct(this);
  memberName = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->memberName)
  ;
  pMVar1 = Structure::getMemberWithName(this_00,memberName);
  return &pMVar1->type;
}

Assistant:

const Type& getType() const override            { return getStruct().getMemberWithName (memberName).type; }